

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void LiteScript::StateExecutor::I_ARRAY_PUSH_LITERAL(State *state,Instruction *instr)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  Object *pOVar4;
  Type *this;
  Array *name;
  undefined1 local_70 [36];
  uint local_4c;
  undefined1 local_48 [8];
  Variable v1;
  undefined1 local_28 [8];
  Variable v2;
  Instruction *instr_local;
  State *state_local;
  
  state->line_num = state->line_num + 1;
  v2.nb_ref = (uint *)instr;
  sVar2 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    (&state->op_lifo);
  if ((1 < sVar2) && (*(char *)((long)v2.nb_ref + 1) == '\x04')) {
    pvVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::back
                       (&state->op_lifo);
    Variable::Variable((Variable *)local_28,pvVar3);
    PopValue(state);
    pvVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::back
                       (&state->op_lifo);
    Variable::Variable((Variable *)local_48,pvVar3);
    pOVar4 = Variable::operator->((Variable *)local_48);
    this = Object::GetType(pOVar4);
    bVar1 = Type::operator!=(this,(Type *)_type_array);
    if (!bVar1) {
      pOVar4 = Variable::operator->((Variable *)local_48);
      name = Object::GetData<LiteScript::Array>(pOVar4);
      Array::operator[]((Array *)local_70,(char *)name);
      Variable::operator=((Variable *)(local_70 + 0x10),(Variable *)local_70);
      Variable::~Variable((Variable *)(local_70 + 0x10));
      Variable::~Variable((Variable *)local_70);
    }
    local_4c = (uint)bVar1;
    Variable::~Variable((Variable *)local_48);
    Variable::~Variable((Variable *)local_28);
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_ARRAY_PUSH_LITERAL(State& state, Instruction& instr) {
    state.line_num++;
    if (state.op_lifo.size() < 2 || instr.comp_type != Instruction::CompType::COMP_TYPE_STRING)
        return;
    Variable v2(state.op_lifo.back());
    PopValue(state);
    Variable v1(state.op_lifo.back());
    if (v1->GetType() != Type::ARRAY)
        return;
    v1->GetData<Array>()[instr.comp_value.v_string] = v2;
}